

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O3

void print_fasta(FILE *fp,char *name,char *comment,char *seq,size_t colwidth)

{
  int iVar1;
  size_t sVar2;
  char *__ptr;
  ulong uVar3;
  undefined8 *puVar4;
  ulong uVar5;
  void *__ptr_00;
  uint uVar6;
  
  sVar2 = strlen(seq);
  __ptr = (char *)malloc(colwidth + 1);
  if (__ptr != (char *)0x0) {
    uVar6 = (uint)sVar2;
    if (colwidth < (ulong)(long)(int)uVar6) {
      if (comment == (char *)0x0) {
        fprintf((FILE *)fp,">%s\n",name);
      }
      else {
        fprintf((FILE *)fp,">%s %s\n",name,comment);
      }
      uVar5 = 0;
      if (0 < (int)uVar6) {
        uVar5 = 0;
        iVar1 = 0;
        do {
          uVar3 = (ulong)iVar1;
          if (uVar3 < colwidth) {
            __ptr[uVar3] = seq[uVar5];
            iVar1 = iVar1 + 1;
          }
          else {
            __ptr[uVar3] = '\0';
            fprintf((FILE *)fp,"%s\n",__ptr);
            *__ptr = seq[uVar5];
            iVar1 = 1;
          }
          uVar5 = uVar5 + 1;
        } while ((uVar6 & 0x7fffffff) != uVar5);
        uVar5 = (ulong)iVar1;
      }
      if (uVar5 < colwidth) {
        __ptr[uVar5] = '\0';
      }
      if (*__ptr != '\0') {
        fprintf((FILE *)fp,"%s\n",__ptr);
      }
    }
    else if (comment == (char *)0x0) {
      fprintf((FILE *)fp,">%s\n%s\n",name,seq);
    }
    else {
      fprintf((FILE *)fp,">%s %s\n%s\n",name,comment,seq);
    }
    free(__ptr);
    return;
  }
  print_fasta_cold_1();
  __ptr_00 = (void *)0x48;
  puVar4 = (undefined8 *)malloc(0x48);
  if (puVar4 != (undefined8 *)0x0) {
    *puVar4 = 0;
    puVar4[1] = 0;
    *(undefined4 *)(puVar4 + 2) = 0;
    puVar4[3] = 0;
    puVar4[4] = 0;
    puVar4[5] = 0;
    puVar4[6] = 0;
    puVar4[7] = 0;
    puVar4[8] = 0;
    return;
  }
  seqdiff_results_init_cold_1();
  free(__ptr_00);
  return;
}

Assistant:

void print_fasta(FILE *fp, char *name, char *comment, char *seq, size_t colwidth)
{
	int l = strlen(seq);   /* sequence length */
	int x,i=0;
	char *seqbuf = NULL;
	seqbuf = (char *)malloc(sizeof(char) * (colwidth + 1));
	if (seqbuf == NULL) {
		fprintf(stderr,"print_seq: out of memory for seqbuf!\n");
		exit(EXIT_FAILURE);
	}

	if (l > colwidth) {                  /* seqlength is > column length - split sequence */
		if (comment == NULL)
			fprintf(fp, ">%s\n",name);
		else
			fprintf(fp, ">%s %s\n",name,comment);

		for (x=0; x<l;x++) {
			if (i < colwidth) {                     /* there's less sequence than the column width */
				seqbuf[i] = seq[x];
				i++;
			} else {                         /* i is >= column width, so print this line */
				seqbuf[i] = '\0';            /* set last position in string to null */
				fprintf(fp, "%s\n",seqbuf);       /* print this line */
				i = 0;                       /* reset i */
				seqbuf[0] = '\0';            /* reset buffer */
				seqbuf[i] = seq[x];   /* set this buffer line to current sequence char */
				i++;
			}
		}
		if (i<colwidth)
			seqbuf[i] = '\0';
		if (strlen(seqbuf) > 0)
			fprintf(fp, "%s\n",seqbuf);
	} else {                     /* seqlength < column length, so just print the full sequence */
		if (comment == NULL)
			fprintf(fp, ">%s\n%s\n",name,seq);
		else
			fprintf(fp, ">%s %s\n%s\n",name,comment,seq);
	}
	free(seqbuf);
}